

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamReader_p.cpp
# Opt level: O1

bool __thiscall
BamTools::Internal::BamReaderPrivate::LoadNextAlignment
          (BamReaderPrivate *this,BamAlignment *alignment)

{
  BgzfStream *this_00;
  pointer *ppCVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  pointer pCVar5;
  iterator __position;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  CigarOp CVar29;
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  size_t sVar33;
  long lVar34;
  char *pcVar35;
  undefined8 unaff_RBP;
  ulong __n;
  ulong uVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  CigarOp op;
  char x [32];
  char buffer [4];
  CigarOp local_70;
  char *local_68;
  uint local_5c;
  undefined4 local_58;
  undefined4 local_54;
  byte local_50 [2];
  undefined2 local_4e;
  undefined2 local_4c;
  undefined2 local_4a;
  uint32_t local_48;
  int32_t local_44;
  int32_t local_40;
  int32_t local_3c;
  uint local_34;
  
  local_34 = 0;
  this_00 = &this->m_stream;
  BgzfStream::Read(this_00,(char *)&local_34,4);
  (alignment->SupportData).BlockLength = local_34;
  if (this->m_isBigEndian == true) {
    (alignment->SupportData).BlockLength =
         local_34 >> 0x18 | (local_34 & 0xff0000) >> 8 | (local_34 & 0xff00) << 8 | local_34 << 0x18
    ;
  }
  if (((alignment->SupportData).BlockLength != 0) &&
     (sVar33 = BgzfStream::Read(this_00,(char *)&local_58,0x20), sVar33 == 0x20)) {
    if (this->m_isBigEndian == true) {
      lVar34 = 0;
      do {
        auVar37 = *(undefined1 (*) [16])(&local_58 + lVar34);
        auVar38[1] = 0;
        auVar38[0] = auVar37[8];
        auVar38[2] = auVar37[9];
        auVar38[3] = 0;
        auVar38[4] = auVar37[10];
        auVar38[5] = 0;
        auVar38[6] = auVar37[0xb];
        auVar38[7] = 0;
        auVar38[8] = auVar37[0xc];
        auVar38[9] = 0;
        auVar38[10] = auVar37[0xd];
        auVar38[0xb] = 0;
        auVar38[0xc] = auVar37[0xe];
        auVar38[0xd] = 0;
        auVar38[0xe] = auVar37[0xf];
        auVar38[0xf] = 0;
        auVar38 = pshuflw(auVar38,auVar38,0x1b);
        auVar38 = pshufhw(auVar38,auVar38,0x1b);
        auVar22[0xd] = 0;
        auVar22._0_13_ = auVar37._0_13_;
        auVar22[0xe] = auVar37[7];
        auVar23[0xc] = auVar37[6];
        auVar23._0_12_ = auVar37._0_12_;
        auVar23._13_2_ = auVar22._13_2_;
        auVar24[0xb] = 0;
        auVar24._0_11_ = auVar37._0_11_;
        auVar24._12_3_ = auVar23._12_3_;
        auVar25[10] = auVar37[5];
        auVar25._0_10_ = auVar37._0_10_;
        auVar25._11_4_ = auVar24._11_4_;
        auVar26[9] = 0;
        auVar26._0_9_ = auVar37._0_9_;
        auVar26._10_5_ = auVar25._10_5_;
        auVar27[8] = auVar37[4];
        auVar27._0_8_ = auVar37._0_8_;
        auVar27._9_6_ = auVar26._9_6_;
        auVar30._7_8_ = 0;
        auVar30._0_7_ = auVar27._8_7_;
        auVar31._1_8_ = SUB158(auVar30 << 0x40,7);
        auVar31[0] = auVar37[3];
        auVar31._9_6_ = 0;
        auVar32._1_10_ = SUB1510(auVar31 << 0x30,5);
        auVar32[0] = auVar37[2];
        auVar32._11_4_ = 0;
        auVar28[2] = auVar37[1];
        auVar28._0_2_ = auVar37._0_2_;
        auVar28._3_12_ = SUB1512(auVar32 << 0x20,3);
        auVar37._0_2_ = auVar37._0_2_ & 0xff;
        auVar37._2_13_ = auVar28._2_13_;
        auVar37[0xf] = 0;
        auVar37 = pshuflw(auVar37,auVar37,0x1b);
        auVar37 = pshufhw(auVar37,auVar37,0x1b);
        sVar6 = auVar37._0_2_;
        sVar7 = auVar37._2_2_;
        sVar8 = auVar37._4_2_;
        sVar9 = auVar37._6_2_;
        sVar10 = auVar37._8_2_;
        sVar11 = auVar37._10_2_;
        sVar12 = auVar37._12_2_;
        sVar13 = auVar37._14_2_;
        sVar14 = auVar38._0_2_;
        sVar15 = auVar38._2_2_;
        sVar16 = auVar38._4_2_;
        sVar17 = auVar38._6_2_;
        sVar18 = auVar38._8_2_;
        sVar19 = auVar38._10_2_;
        sVar20 = auVar38._12_2_;
        sVar21 = auVar38._14_2_;
        lVar2 = lVar34 * 4;
        *(char *)(&local_58 + lVar34) = (0 < sVar6) * (sVar6 < 0x100) * auVar37[0] - (0xff < sVar6);
        *(char *)((long)&local_58 + lVar2 + 1) =
             (0 < sVar7) * (sVar7 < 0x100) * auVar37[2] - (0xff < sVar7);
        *(char *)((long)&local_58 + lVar2 + 2) =
             (0 < sVar8) * (sVar8 < 0x100) * auVar37[4] - (0xff < sVar8);
        *(char *)((long)&local_58 + lVar2 + 3) =
             (0 < sVar9) * (sVar9 < 0x100) * auVar37[6] - (0xff < sVar9);
        local_50[lVar2 + -4] = (0 < sVar10) * (sVar10 < 0x100) * auVar37[8] - (0xff < sVar10);
        local_50[lVar2 + -3] = (0 < sVar11) * (sVar11 < 0x100) * auVar37[10] - (0xff < sVar11);
        local_50[lVar2 + -2] = (0 < sVar12) * (sVar12 < 0x100) * auVar37[0xc] - (0xff < sVar12);
        local_50[lVar2 + -1] = (0 < sVar13) * (sVar13 < 0x100) * auVar37[0xe] - (0xff < sVar13);
        local_50[lVar2] = (0 < sVar14) * (sVar14 < 0x100) * auVar38[0] - (0xff < sVar14);
        local_50[lVar2 + 1] = (0 < sVar15) * (sVar15 < 0x100) * auVar38[2] - (0xff < sVar15);
        *(char *)(&local_4e + lVar34 * 2) =
             (0 < sVar16) * (sVar16 < 0x100) * auVar38[4] - (0xff < sVar16);
        *(char *)((long)&local_4e + lVar2 + 1) =
             (0 < sVar17) * (sVar17 < 0x100) * auVar38[6] - (0xff < sVar17);
        *(char *)(&local_4c + lVar34 * 2) =
             (0 < sVar18) * (sVar18 < 0x100) * auVar38[8] - (0xff < sVar18);
        *(char *)((long)&local_4c + lVar2 + 1) =
             (0 < sVar19) * (sVar19 < 0x100) * auVar38[10] - (0xff < sVar19);
        *(char *)(&local_4a + lVar34 * 2) =
             (0 < sVar20) * (sVar20 < 0x100) * auVar38[0xc] - (0xff < sVar20);
        *(char *)((long)&local_4a + lVar2 + 1) =
             (0 < sVar21) * (sVar21 < 0x100) * auVar38[0xe] - (0xff < sVar21);
        lVar34 = lVar34 + 4;
      } while (lVar34 != 8);
    }
    alignment->RefID = local_58;
    alignment->Position = local_54;
    alignment->Bin = local_4e;
    alignment->MapQuality = (ushort)local_50[1];
    (alignment->SupportData).QueryNameLength = (uint)local_50[0];
    alignment->AlignmentFlag = (uint)local_4a;
    (alignment->SupportData).NumCigarOperations = (uint)local_4c;
    (alignment->SupportData).QuerySequenceLength = local_48;
    alignment->MateRefID = local_44;
    alignment->MatePosition = local_40;
    alignment->InsertSize = local_3c;
    alignment->Length = local_48;
    __n = (ulong)((alignment->SupportData).BlockLength - 0x20);
    pcVar35 = (char *)operator_new__(__n);
    memset(pcVar35,0,__n);
    sVar33 = BgzfStream::Read(this_00,pcVar35,__n);
    uVar36 = CONCAT71((int7)((ulong)unaff_RBP >> 8),sVar33 == __n);
    if (sVar33 == __n) {
      std::__cxx11::string::_M_replace
                ((ulong)&alignment->SupportData,0,
                 (char *)(alignment->SupportData).AllCharData._M_string_length,(ulong)pcVar35);
      uVar3 = (alignment->SupportData).QueryNameLength;
      local_70._0_4_ = local_70._0_4_ & 0xffffff00;
      local_70.Length = 0;
      pCVar5 = (alignment->CigarData).
               super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((alignment->CigarData).
          super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
          super__Vector_impl_data._M_finish != pCVar5) {
        (alignment->CigarData).
        super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
        super__Vector_impl_data._M_finish = pCVar5;
      }
      local_5c = (uint)uVar36;
      local_68 = pcVar35;
      std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::reserve
                (&alignment->CigarData,(ulong)(alignment->SupportData).NumCigarOperations);
      pcVar35 = local_68;
      if ((alignment->SupportData).NumCigarOperations != 0) {
        uVar36 = 0;
        do {
          if (this->m_isBigEndian == true) {
            uVar4 = *(uint *)(pcVar35 + uVar36 * 4 + (ulong)uVar3);
            *(uint *)(pcVar35 + uVar36 * 4 + (ulong)uVar3) =
                 uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
          }
          local_70.Length = *(uint *)(pcVar35 + uVar36 * 4 + (ulong)uVar3) >> 4;
          local_70.Type = "MIDNSHP=X"[*(uint *)(pcVar35 + uVar36 * 4 + (ulong)uVar3) & 0xf];
          __position._M_current =
               (alignment->CigarData).
               super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (alignment->CigarData).
              super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<BamTools::CigarOp,std::allocator<BamTools::CigarOp>>::
            _M_realloc_insert<BamTools::CigarOp_const&>
                      ((vector<BamTools::CigarOp,std::allocator<BamTools::CigarOp>> *)
                       &alignment->CigarData,__position,&local_70);
          }
          else {
            CVar29.Length = local_70.Length;
            CVar29.Type = "MIDNSHP=X"[*(uint *)(pcVar35 + uVar36 * 4 + (ulong)uVar3) & 0xf];
            CVar29._1_3_ = local_70._1_3_;
            *__position._M_current = CVar29;
            ppCVar1 = &(alignment->CigarData).
                       super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppCVar1 = *ppCVar1 + 1;
          }
          uVar36 = uVar36 + 1;
        } while (uVar36 < (alignment->SupportData).NumCigarOperations);
      }
      uVar36 = (ulong)local_5c;
      pcVar35 = local_68;
    }
    operator_delete__(pcVar35);
    return (bool)(char)uVar36;
  }
  return false;
}

Assistant:

bool BamReaderPrivate::LoadNextAlignment(BamAlignment& alignment) {

    // read in the 'block length' value, make sure it's not zero
    char buffer[sizeof(uint32_t)];
    fill_n(buffer, sizeof(uint32_t), 0);
    m_stream.Read(buffer, sizeof(uint32_t));
    alignment.SupportData.BlockLength = BamTools::UnpackUnsignedInt(buffer);
    if ( m_isBigEndian ) BamTools::SwapEndian_32(alignment.SupportData.BlockLength);
    if ( alignment.SupportData.BlockLength == 0 )
        return false;

    // read in core alignment data, make sure the right size of data was read
    char x[Constants::BAM_CORE_SIZE];
    if ( m_stream.Read(x, Constants::BAM_CORE_SIZE) != Constants::BAM_CORE_SIZE )
        return false;

    // swap core endian-ness if necessary
    if ( m_isBigEndian ) {
        for ( unsigned int i = 0; i < Constants::BAM_CORE_SIZE; i+=sizeof(uint32_t) )
            BamTools::SwapEndian_32p(&x[i]);
    }

    // set BamAlignment 'core' and 'support' data
    alignment.RefID    = BamTools::UnpackSignedInt(&x[0]);
    alignment.Position = BamTools::UnpackSignedInt(&x[4]);

    unsigned int tempValue = BamTools::UnpackUnsignedInt(&x[8]);
    alignment.Bin        = tempValue >> 16;
    alignment.MapQuality = tempValue >> 8 & 0xff;
    alignment.SupportData.QueryNameLength = tempValue & 0xff;

    tempValue = BamTools::UnpackUnsignedInt(&x[12]);
    alignment.AlignmentFlag = tempValue >> 16;
    alignment.SupportData.NumCigarOperations = tempValue & 0xffff;

    alignment.SupportData.QuerySequenceLength = BamTools::UnpackUnsignedInt(&x[16]);
    alignment.MateRefID    = BamTools::UnpackSignedInt(&x[20]);
    alignment.MatePosition = BamTools::UnpackSignedInt(&x[24]);
    alignment.InsertSize   = BamTools::UnpackSignedInt(&x[28]);

    // set BamAlignment length
    alignment.Length = alignment.SupportData.QuerySequenceLength;

    // read in character data - make sure proper data size was read
    bool readCharDataOK = false;
    const unsigned int dataLength = alignment.SupportData.BlockLength - Constants::BAM_CORE_SIZE;
    RaiiBuffer allCharData(dataLength);

    if ( m_stream.Read(allCharData.Buffer, dataLength) == dataLength ) {

        // store 'allCharData' in supportData structure
        alignment.SupportData.AllCharData.assign((const char*)allCharData.Buffer, dataLength);

        // set success flag
        readCharDataOK = true;

        // save CIGAR ops
        // need to calculate this here so that  BamAlignment::GetEndPosition() performs correctly,
        // even when GetNextAlignmentCore() is called
        const unsigned int cigarDataOffset = alignment.SupportData.QueryNameLength;
        uint32_t* cigarData = (uint32_t*)(allCharData.Buffer + cigarDataOffset);
        CigarOp op;
        alignment.CigarData.clear();
        alignment.CigarData.reserve(alignment.SupportData.NumCigarOperations);
        for ( unsigned int i = 0; i < alignment.SupportData.NumCigarOperations; ++i ) {

            // swap endian-ness if necessary
            if ( m_isBigEndian ) BamTools::SwapEndian_32(cigarData[i]);

            // build CigarOp structure
            op.Length = (cigarData[i] >> Constants::BAM_CIGAR_SHIFT);
            op.Type   = Constants::BAM_CIGAR_LOOKUP[ (cigarData[i] & Constants::BAM_CIGAR_MASK) ];

            // save CigarOp
            alignment.CigarData.push_back(op);
        }
    }

    // return success/failure
    return readCharDataOK;
}